

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O1

void __thiscall Pl_DCT::finish(Pl_DCT *this)

{
  int iVar1;
  Buffer *this_00;
  size_t sVar2;
  runtime_error *this_01;
  qpdf_jpeg_error_mgr jerr;
  jpeg_compress_struct cinfo_compress;
  jpeg_decompress_struct cinfo_decompress;
  code *local_698;
  code *local_690;
  __jmp_buf_tag local_5f0;
  undefined1 *local_528;
  undefined8 local_520;
  undefined1 local_518;
  undefined7 uStack_517;
  undefined8 local_508 [73];
  undefined8 local_2c0 [82];
  
  Pl_Buffer::finish(&((this->m)._M_t.
                      super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>
                      .super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl)->buf);
  this_00 = Pl_Buffer::getBuffer
                      (&((this->m)._M_t.
                         super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>
                         .super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl)->buf);
  sVar2 = Buffer::getSize(this_00);
  if (sVar2 == 0) {
    Buffer::~Buffer(this_00);
    operator_delete(this_00,8);
    (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
  }
  else {
    local_520 = 0;
    local_518 = 0;
    local_528 = &local_518;
    local_508[0] = jpeg_std_error(&local_698);
    local_2c0[0] = jpeg_std_error(&local_698);
    local_698 = error_handler;
    if ((((this->m)._M_t.
          super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
          super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
          super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl)->action == a_decompress) &&
       ((anonymous_namespace)::throw_on_corrupt_data == '\x01')) {
      local_690 = emit_message;
    }
    iVar1 = _setjmp(&local_5f0);
    if (iVar1 == 0) {
      if (((this->m)._M_t.
           super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
           super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
           super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl)->action == a_compress) {
        compress(this,local_508,this_00);
      }
      else {
        decompress(this,local_2c0,this_00);
      }
    }
    Buffer::~Buffer(this_00);
    operator_delete(this_00,8);
    if (((this->m)._M_t.
         super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
         super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
         super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl)->action == a_compress) {
      jpeg_destroy_compress(local_508);
    }
    if (((this->m)._M_t.
         super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
         super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
         super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl)->action == a_decompress) {
      jpeg_destroy_decompress(local_2c0);
    }
    if (iVar1 != 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&local_528);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_528 != &local_518) {
      operator_delete(local_528,CONCAT71(uStack_517,local_518) + 1);
    }
  }
  return;
}

Assistant:

void
Pl_DCT::finish()
{
    m->buf.finish();

    // Using a std::shared_ptr<Buffer> here and passing it into compress and decompress causes a
    // memory leak with setjmp/longjmp. Just use a pointer and delete it.
    Buffer* b = m->buf.getBuffer();
    if (b->getSize() == 0) {
        // Special case: empty data will never succeed and probably means we're calling finish a
        // second time from an exception handler.
        delete b;
        next()->finish();
        return;
    }

    struct jpeg_compress_struct cinfo_compress;
    struct jpeg_decompress_struct cinfo_decompress;
    struct qpdf_jpeg_error_mgr jerr;

    cinfo_compress.err = jpeg_std_error(&(jerr.pub));
    cinfo_decompress.err = jpeg_std_error(&(jerr.pub));
    jerr.pub.error_exit = error_handler;
    if (m->action == a_decompress && throw_on_corrupt_data) {
        jerr.pub.emit_message = emit_message;
    }

    bool error = false;
    // The jpeg library is a "C" library, so we use setjmp and longjmp for exception handling.
    if (setjmp(jerr.jmpbuf) == 0) {
        try {
            if (m->action == a_compress) {
                compress(reinterpret_cast<void*>(&cinfo_compress), b);
            } else {
                decompress(reinterpret_cast<void*>(&cinfo_decompress), b);
            }
        } catch (std::exception& e) {
            // Convert an exception back to a longjmp so we can ensure that the right cleanup
            // happens. This will get converted back to an exception.
            jerr.msg = e.what();
            longjmp(jerr.jmpbuf, 1);
        }
    } else {
        error = true;
    }
    delete b;

    if (m->action == a_compress) {
        jpeg_destroy_compress(&cinfo_compress);
    }
    if (m->action == a_decompress) {
        jpeg_destroy_decompress(&cinfo_decompress);
    }
    if (error) {
        throw std::runtime_error(jerr.msg);
    }
}